

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>
          (buffer_appender<char> out,big_decimal_fp *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  buffer_appender<char> bVar6;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  char cVar13;
  buffer<char> *buf;
  uint uVar14;
  int num_zeros;
  sign_t sign;
  int significand_size;
  anon_class_40_7_ef14d3db write;
  char *significand;
  int exp;
  undefined1 local_8d [5];
  sign_t local_88;
  int local_84;
  anon_class_56_7_a2a26a24 local_80;
  char ********local_48;
  int local_3c;
  float_specs local_38;
  
  local_48 = (char ********)fp->significand;
  local_84 = fp->significand_size;
  uVar11 = fspecs._4_4_;
  local_88 = uVar11 >> 8 & 0xff;
  local_8d[0] = decimal_point;
  local_38 = fspecs;
  if (local_84 < 0) goto LAB_0020f9a6;
  uVar12 = (ulong)((local_84 + 1) - (uint)(local_88 == none));
  uVar2 = fp->exponent;
  iVar10 = uVar2 + local_84;
  uVar7 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0020f5f8:
    iVar4 = uVar2 + local_84 + -1;
    if ((uVar11 >> 0x14 & 1) == 0) {
      uVar9 = 0;
      uVar5 = (ulong)(byte)decimal_point;
      if (local_84 == 1) {
        uVar5 = uVar9;
      }
      cVar13 = (char)uVar5;
    }
    else {
      uVar9 = 0;
      if (0 < (int)(uVar7 - local_84)) {
        uVar9 = (ulong)(uVar7 - local_84);
      }
      uVar12 = uVar12 + uVar9;
      cVar13 = decimal_point;
    }
    iVar3 = 1 - iVar10;
    if (0 < iVar10) {
      iVar3 = iVar4;
    }
    lVar8 = 2;
    if (99 < iVar3) {
      lVar8 = (ulong)(999 < iVar3) + 3;
    }
    uVar5 = (3 - (ulong)(cVar13 == '\0')) + uVar12 + lVar8;
    local_80.sign = (sign_t *)(CONCAT44(local_80.sign._4_4_,uVar11 >> 8) & 0xffffffff000000ff);
    local_80.significand_size._0_5_ = CONCAT14(cVar13,local_84);
    local_80.fp = (big_decimal_fp *)
                  (CONCAT35(local_80.fp._5_3_,CONCAT14(((uVar11 >> 0x10 & 1) == 0) << 5,(int)uVar9))
                  | 0x4500000000);
    local_80.fspecs = (float_specs *)CONCAT44(local_80.fspecs._4_4_,iVar4);
    uVar12 = (ulong)specs->width;
    local_80.significand = (char **)local_48;
    if ((long)uVar12 < 1) {
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) <
          uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10)) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      bVar6 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
              ::anon_class_40_7_ef14d3db::operator()
                        ((anon_class_40_7_ef14d3db *)&local_80,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar9 = 0;
    if (uVar5 <= uVar12) {
      uVar9 = uVar12 - uVar5;
    }
    bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + (specs->fill).size_ * uVar9) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    uVar12 = uVar9 >> (bVar1 & 0x3f);
    bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar12,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                   ::anon_class_40_7_ef14d3db::operator()
                             ((anon_class_40_7_ef14d3db *)&local_80,
                              bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    goto LAB_0020f8b2;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar14 = 0x10;
    if (0 < (int)uVar7) {
      uVar14 = uVar7;
    }
    if ((iVar10 < -3) || ((int)uVar14 < iVar10)) goto LAB_0020f5f8;
  }
  local_3c = iVar10;
  if ((int)uVar2 < 0) {
    if (iVar10 < 1) {
      uVar11 = -iVar10;
      local_8d._1_4_ = uVar11;
      if (SBORROW4(uVar7,uVar11) != (int)(uVar7 + iVar10) < 0) {
        local_8d._1_4_ = uVar7;
      }
      if ((int)uVar7 < 0) {
        local_8d._1_4_ = uVar11;
      }
      if (local_84 != 0) {
        local_8d._1_4_ = uVar11;
      }
      if (-1 < (int)local_8d._1_4_) {
        local_80.sign = &local_88;
        local_80.significand = (char **)(local_8d + 1);
        local_80.significand_size = &local_84;
        local_80.fp = (big_decimal_fp *)&local_38;
        local_80.fspecs = (float_specs *)local_8d;
        local_80.decimal_point = (char *)&local_48;
        uVar5 = (ulong)specs->width;
        if (-1 < (long)uVar5) {
          uVar12 = (uint)local_8d._1_4_ + uVar12 + 2;
          uVar9 = 0;
          if (uVar12 <= uVar5) {
            uVar9 = uVar5 - uVar12;
          }
          bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf));
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              uVar12 + *(long *)((long)out.
                                       super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                       container + 0x10) + (specs->fill).size_ * uVar9) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar12 = uVar9 >> (bVar1 & 0x3f);
          bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar12,&specs->fill);
          it.container = (buffer<char> *)
                         write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                         ::anon_class_48_6_9afe1116::operator()
                                   ((anon_class_48_6_9afe1116 *)&local_80,
                                    bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                    .container);
          goto LAB_0020f8b2;
        }
      }
    }
    else {
      local_8d._1_4_ = uVar7 - local_84 & (int)(uVar11 << 0xb) >> 0x1f;
      local_80.decimal_point = local_8d + 1;
      local_80.sign = &local_88;
      local_80.significand = (char **)&local_48;
      local_80.significand_size = &local_84;
      local_80.fp = (big_decimal_fp *)&local_3c;
      local_80.fspecs = (float_specs *)local_8d;
      uVar5 = (ulong)specs->width;
      if (-1 < (long)uVar5) {
        uVar9 = (ulong)(uint)local_8d._1_4_;
        if ((int)local_8d._1_4_ < 1) {
          uVar9 = 0;
        }
        uVar12 = uVar9 + uVar12 + 1;
        uVar9 = 0;
        if (uVar12 <= uVar5) {
          uVar9 = uVar5 - uVar12;
        }
        bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar12 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                     container + 0x10) + (specs->fill).size_ * uVar9) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar12 = uVar9 >> (bVar1 & 0x3f);
        bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar12,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                       ::anon_class_48_6_48d028d1::operator()
                                 ((anon_class_48_6_48d028d1 *)&local_80,
                                  bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
        goto LAB_0020f8b2;
      }
    }
    goto LAB_0020f9a6;
  }
  uVar12 = uVar2 + uVar12;
  local_8d._1_4_ = uVar7 - iVar10;
  if ((uVar11 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_8d._1_4_) {
      if ((int)local_8d._1_4_ < 1) goto LAB_0020f803;
    }
    else {
      local_8d._1_4_ = 1;
    }
    uVar12 = uVar12 + (uint)local_8d._1_4_;
  }
LAB_0020f803:
  local_80.sign = &local_88;
  local_80.significand = (char **)&local_48;
  local_80.significand_size = &local_84;
  local_80.fspecs = &local_38;
  local_80.decimal_point = local_8d;
  local_80.num_zeros = (int *)(local_8d + 1);
  uVar5 = (ulong)specs->width;
  local_80.fp = fp;
  if ((long)uVar5 < 0) {
LAB_0020f9a6:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar9 = 0;
  if (uVar12 <= uVar5) {
    uVar9 = uVar5 - uVar12;
  }
  bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)specs->field_0x9 & 0xf));
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar12 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x10) + (specs->fill).size_ * uVar9) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar12 = uVar9 >> (bVar1 & 0x3f);
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar12,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                 ::anon_class_56_7_a2a26a24::operator()
                           (&local_80,
                            bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_0020f8b2:
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar9 - uVar12,&specs->fill);
  return (buffer_appender<char>)
         bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}